

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O0

void __thiscall
Renderer::renderLighting
          (Renderer *this,vector<Light_*,_std::allocator<Light_*>_> *lights,Shader *shader)

{
  GLfloat GVar1;
  GLfloat GVar2;
  PFNGLGETUNIFORMLOCATIONPROC p_Var3;
  PFNGLUNIFORM1FPROC p_Var4;
  PFNGLUNIFORM1IPROC p_Var5;
  PFNGLUNIFORM3FPROC p_Var6;
  GLuint GVar7;
  GLint GVar8;
  size_type sVar9;
  ulong uVar10;
  GLchar *pGVar11;
  reference ppLVar12;
  string local_2e0 [32];
  string local_2c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240 [32];
  string local_220 [32];
  string local_200 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0 [48];
  stringstream local_1b0 [8];
  stringstream indexString;
  ostream local_1a0 [380];
  int local_24;
  Shader *pSStack_20;
  int i;
  Shader *shader_local;
  vector<Light_*,_std::allocator<Light_*>_> *lights_local;
  Renderer *this_local;
  
  p_Var5 = __glewUniform1i;
  p_Var3 = __glewGetUniformLocation;
  pSStack_20 = shader;
  shader_local = (Shader *)lights;
  lights_local = (vector<Light_*,_std::allocator<Light_*>_> *)this;
  GVar7 = Shader::getProgramId(shader);
  GVar8 = (*p_Var3)(GVar7,"numLights");
  sVar9 = std::vector<Light_*,_std::allocator<Light_*>_>::size(lights);
  (*p_Var5)(GVar8,(GLint)sVar9);
  local_24 = 0;
  while( true ) {
    uVar10 = (ulong)local_24;
    sVar9 = std::vector<Light_*,_std::allocator<Light_*>_>::size(lights);
    if (sVar9 <= uVar10) break;
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::ostream::operator<<(local_1a0,local_24);
    p_Var6 = __glewUniform3f;
    p_Var3 = __glewGetUniformLocation;
    GVar7 = Shader::getProgramId(pSStack_20);
    std::__cxx11::stringstream::str();
    std::operator+((char *)local_200,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "pointLights[");
    std::operator+(local_1e0,(char *)local_200);
    pGVar11 = (GLchar *)std::__cxx11::string::c_str();
    GVar8 = (*p_Var3)(GVar7,pGVar11);
    ppLVar12 = std::vector<Light_*,_std::allocator<Light_*>_>::operator[](lights,(long)local_24);
    GVar1 = ((*ppLVar12)->position).field_0.field_0.x;
    ppLVar12 = std::vector<Light_*,_std::allocator<Light_*>_>::operator[](lights,(long)local_24);
    GVar2 = ((*ppLVar12)->position).field_0.field_0.y;
    ppLVar12 = std::vector<Light_*,_std::allocator<Light_*>_>::operator[](lights,(long)local_24);
    (*p_Var6)(GVar8,GVar1,GVar2,((*ppLVar12)->position).field_0.field_0.z);
    std::__cxx11::string::~string((string *)local_1e0);
    std::__cxx11::string::~string(local_200);
    std::__cxx11::string::~string(local_220);
    p_Var6 = __glewUniform3f;
    p_Var3 = __glewGetUniformLocation;
    GVar7 = Shader::getProgramId(pSStack_20);
    std::__cxx11::stringstream::str();
    std::operator+((char *)local_260,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "pointLights[");
    std::operator+(local_240,(char *)local_260);
    pGVar11 = (GLchar *)std::__cxx11::string::c_str();
    GVar8 = (*p_Var3)(GVar7,pGVar11);
    ppLVar12 = std::vector<Light_*,_std::allocator<Light_*>_>::operator[](lights,(long)local_24);
    GVar1 = ((*ppLVar12)->color).field_0.field_0.x;
    ppLVar12 = std::vector<Light_*,_std::allocator<Light_*>_>::operator[](lights,(long)local_24);
    GVar2 = ((*ppLVar12)->color).field_0.field_0.y;
    ppLVar12 = std::vector<Light_*,_std::allocator<Light_*>_>::operator[](lights,(long)local_24);
    (*p_Var6)(GVar8,GVar1,GVar2,((*ppLVar12)->color).field_0.field_0.z);
    std::__cxx11::string::~string((string *)local_240);
    std::__cxx11::string::~string(local_260);
    std::__cxx11::string::~string(local_280);
    p_Var4 = __glewUniform1f;
    p_Var3 = __glewGetUniformLocation;
    GVar7 = Shader::getProgramId(pSStack_20);
    std::__cxx11::stringstream::str();
    std::operator+((char *)local_2c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "pointLights[");
    std::operator+(local_2a0,(char *)local_2c0);
    pGVar11 = (GLchar *)std::__cxx11::string::c_str();
    GVar8 = (*p_Var3)(GVar7,pGVar11);
    ppLVar12 = std::vector<Light_*,_std::allocator<Light_*>_>::operator[](lights,(long)local_24);
    (*p_Var4)(GVar8,(*ppLVar12)->brightness);
    std::__cxx11::string::~string((string *)local_2a0);
    std::__cxx11::string::~string(local_2c0);
    std::__cxx11::string::~string(local_2e0);
    std::__cxx11::stringstream::~stringstream(local_1b0);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Renderer::renderLighting(std::vector<Light*> lights, Shader* shader)
{
	glUniform1i(glGetUniformLocation(shader->getProgramId(), "numLights"), lights.size());

	for (int i = 0; i < lights.size(); i++)
	{
		std::stringstream indexString;
		indexString << i;
		glUniform3f(glGetUniformLocation(shader->getProgramId(), ("pointLights[" + indexString.str() + "].position").c_str()), lights[i]->position.x, lights[i]->position.y, lights[i]->position.z);
		glUniform3f(glGetUniformLocation(shader->getProgramId(), ("pointLights[" + indexString.str() + "].color").c_str()), lights[i]->color.x, lights[i]->color.y, lights[i]->color.z);
		glUniform1f(glGetUniformLocation(shader->getProgramId(), ("pointLights[" + indexString.str() + "].brightness").c_str()), lights[i]->brightness);
	}
}